

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write<char,fmt::v8::appender>(appender out,char *value)

{
  char *pcVar1;
  appender aVar2;
  basic_string_view<char> value_00;
  char *value_local;
  appender out_local;
  
  if (value == (char *)0x0) {
    throw_format_error("string pointer is null");
  }
  pcVar1 = (char *)std::char_traits<char>::length(value);
  value_00.size_ = (size_t)pcVar1;
  value_00.data_ = pcVar1;
  aVar2 = write<char,fmt::v8::appender>
                    ((detail *)
                     out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                     (appender)value,value_00);
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}